

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int uncompress2file(char *filename,FILE *indiskfile,FILE *outdiskfile,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RCX;
  FILE *in_RDX;
  FILE *in_RSI;
  z_stream d_stream;
  char *outfilebuff;
  char *infilebuff;
  unsigned_long bytes_out;
  int len;
  int err;
  void *local_b8;
  int local_b0;
  void *local_a0;
  undefined4 local_98;
  ulong local_90;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  void *local_48;
  void *local_40;
  ulong local_38;
  int local_30;
  int local_2c;
  int *local_28;
  FILE *local_20;
  FILE *local_18;
  int local_4;
  
  local_38 = 0;
  if (*in_RCX < 1) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_40 = malloc(0x1c200);
    if (local_40 == (void *)0x0) {
      *local_28 = 0x71;
      local_4 = 0x71;
    }
    else {
      local_a0 = malloc(0x1c200);
      if (local_a0 == (void *)0x0) {
        *local_28 = 0x71;
        local_4 = 0x71;
      }
      else {
        local_78 = 0;
        local_70 = 0;
        local_68 = 0;
        local_98 = 0x1c200;
        local_48 = local_a0;
        iVar1 = inflateInit2_(&local_b8,0x1f,"1.2.11",0x70);
        if (iVar1 == 0) {
          local_2c = 0;
          do {
            sVar2 = fread(local_40,1,0x1c200,local_18);
            local_30 = (int)sVar2;
            iVar1 = ferror(local_18);
            if (iVar1 != 0) {
              inflateEnd(&local_b8);
              free(local_40);
              free(local_48);
              *local_28 = 0x19e;
              return 0x19e;
            }
            if (local_30 == 0) break;
            local_b8 = local_40;
            local_b0 = local_30;
            while (local_2c = inflate(&local_b8,0), local_2c != 1) {
              if ((local_2c != 0) && (local_2c != -5)) {
                inflateEnd(&local_b8);
                free(local_40);
                free(local_48);
                *local_28 = 0x19e;
                return 0x19e;
              }
              if (local_b0 == 0) break;
              sVar2 = fwrite(local_48,1,0x1c200,local_20);
              if ((int)sVar2 != 0x1c200) {
                inflateEnd(&local_b8);
                free(local_40);
                free(local_48);
                *local_28 = 0x19e;
                return 0x19e;
              }
              local_38 = local_38 + 0x1c200;
              local_a0 = local_48;
              local_98 = 0x1c200;
            }
            iVar1 = feof(local_18);
          } while (iVar1 == 0);
          if ((local_38 < local_90) &&
             (sVar2 = fwrite(local_48,1,local_90 - local_38,local_20),
             (long)(int)sVar2 != local_90 - local_38)) {
            inflateEnd(&local_b8);
            free(local_40);
            free(local_48);
            *local_28 = 0x19e;
            local_4 = 0x19e;
          }
          else {
            free(local_40);
            free(local_48);
            iVar1 = inflateEnd(&local_b8);
            if (iVar1 == 0) {
              local_4 = *local_28;
            }
            else {
              *local_28 = 0x19e;
              local_4 = 0x19e;
            }
          }
        }
        else {
          *local_28 = 0x19e;
          local_4 = 0x19e;
        }
      }
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int uncompress2file(char *filename,  /* name of input file                  */
             FILE *indiskfile,     /* I - input file pointer                */
             FILE *outdiskfile,    /* I - output file pointer               */
             int *status)        /* IO - error status                       */
/*
  Uncompress the file into another file. 
*/
{
    int err, len;
    unsigned long bytes_out = 0;
    char *infilebuff, *outfilebuff;
    z_stream d_stream;   /* decompression stream */

    if (*status > 0) 
        return(*status); 

    /* Allocate buffers to hold compressed and uncompressed */
    infilebuff = (char*)malloc(GZBUFSIZE);
    if (!infilebuff) return(*status = 113); /* memory error */

    outfilebuff = (char*)malloc(GZBUFSIZE);
    if (!outfilebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;

    d_stream.next_out = (unsigned char*) outfilebuff;
    d_stream.avail_out = GZBUFSIZE;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(infilebuff, 1, GZBUFSIZE, indiskfile);
	if (ferror(indiskfile)) {
              inflateEnd(&d_stream);
              free(infilebuff);
              free(outfilebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)infilebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */

                if (!d_stream.avail_in) break; /* need more input */
		
                /* flush out the full output buffer */
                if ((int)fwrite(outfilebuff, 1, GZBUFSIZE, outdiskfile) != GZBUFSIZE) {
                    inflateEnd(&d_stream);
                    free(infilebuff);
                    free(outfilebuff);
                    return(*status = 414);
                }
                bytes_out += GZBUFSIZE;
                d_stream.next_out = (unsigned char*) outfilebuff;
                d_stream.avail_out = GZBUFSIZE;

            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(infilebuff);
                free(outfilebuff);
                return(*status = 414);
            }
        }
	
	if (feof(indiskfile))  break;
    }

    /* write out any remaining bytes in the buffer */
    if (d_stream.total_out > bytes_out) {
        if ((int)fwrite(outfilebuff, 1, (d_stream.total_out - bytes_out), outdiskfile) 
	    != (d_stream.total_out - bytes_out)) {
            inflateEnd(&d_stream);
            free(infilebuff);
            free(outfilebuff);
            return(*status = 414);
        }
    }

    free(infilebuff); /* free temporary output data buffer */
    free(outfilebuff); /* free temporary output data buffer */

    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}